

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::piece_picker::dec_refcount_all(piece_picker *this,torrent_peer *peer)

{
  bool bVar1;
  reference ppVar2;
  piece_pos *i;
  iterator __end2;
  iterator __begin2;
  vector<piece_pos,_piece_index_t> *__range2;
  torrent_peer *peer_local;
  piece_picker *this_local;
  
  if (this->m_seeds < 1) {
    __end2 = ::std::
             vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
             ::begin((vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      *)this);
    i = (piece_pos *)
        ::std::
        vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
        ::end((vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
               *)this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<libtorrent::aux::piece_picker::piece_pos_*,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
                                       *)&i), bVar1) {
      ppVar2 = __gnu_cxx::
               __normal_iterator<libtorrent::aux::piece_picker::piece_pos_*,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
               ::operator*(&__end2);
      *(uint *)ppVar2 = *(uint *)ppVar2 & 0xfc000000 | (*(uint *)ppVar2 & 0x3ffffff) - 1 & 0x3ffffff
      ;
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::piece_picker::piece_pos_*,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
      ::operator++(&__end2);
    }
    this->m_dirty = true;
  }
  else {
    this->m_seeds = this->m_seeds + -1;
    if (this->m_seeds == 0) {
      this->m_dirty = true;
    }
  }
  return;
}

Assistant:

void piece_picker::dec_refcount_all(const aux::torrent_peer* peer)
	{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
		INVARIANT_CHECK;
#endif

		if (m_seeds > 0)
		{
			--m_seeds;
			if (m_seeds == 0)
			{
				// when m_seeds is decreased from 1 to 0
				// we may have to remove pieces that previously
				// didn't have any peers
				m_dirty = true;
			}
#ifdef TORRENT_DEBUG_REFCOUNTS
			for (std::vector<piece_pos>::iterator i = m_piece_map.begin()
				, end(m_piece_map.end()); i != end; ++i)
			{
				TORRENT_ASSERT(i->have_peers.count(peer) == 1);
				i->have_peers.erase(peer);
			}
#else
			TORRENT_UNUSED(peer);
#endif
			return;
		}
		TORRENT_ASSERT(m_seeds == 0);

		for (auto& i : m_piece_map)
		{
#ifdef TORRENT_DEBUG_REFCOUNTS
			TORRENT_ASSERT(i.have_peers.count(peer) == 1);
			i.have_peers.erase(peer);
#else
			TORRENT_UNUSED(peer);
#endif

			TORRENT_ASSERT(i.peer_count > 0);
			--i.peer_count;
		}

		m_dirty = true;
	}